

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Operations::Operations(Operations *this,int argc,char **argv)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__nbytes;
  void *__buf;
  path local_258;
  ifstream in;
  
  Configuration::Configuration(&this->config);
  this->loadStatus = Unloaded;
  this->inferredComponents = false;
  std::__cxx11::string::string((string *)&this->programName,*argv,(allocator *)&in);
  p_Var1 = &(this->commands)._M_t._M_impl.super__Rb_tree_header;
  (this->commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->commands)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char_const**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->allArgs,
             argv + 1,argv + argc,(allocator_type *)&in);
  (this->components)._M_h._M_buckets = &(this->components)._M_h._M_single_bucket;
  (this->components)._M_h._M_bucket_count = 1;
  (this->components)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->components)._M_h._M_element_count = 0;
  (this->components)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->components)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->components)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->files)._M_h._M_buckets = &(this->files)._M_h._M_single_bucket;
  (this->files)._M_h._M_bucket_count = 1;
  (this->files)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->files)._M_h._M_element_count = 0;
  (this->files)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->files)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->files)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->collisions)._M_t._M_impl.super__Rb_tree_header;
  (this->collisions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->collisions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->collisions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->collisions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->collisions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->includeLookup)._M_h._M_buckets = &(this->includeLookup)._M_h._M_single_bucket;
  (this->includeLookup)._M_h._M_bucket_count = 1;
  (this->includeLookup)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->includeLookup)._M_h._M_element_count = 0;
  (this->includeLookup)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->includeLookup)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->includeLookup)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->ambiguous)._M_t._M_impl.super__Rb_tree_header;
  (this->ambiguous)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ambiguous)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ambiguous)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ambiguous)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ambiguous)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->deleteComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->deleteComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->deleteComponents)._M_t._M_impl.super__Rb_tree_header;
  (this->deleteComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->deleteComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->deleteComponents)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->outputRoot).m_pathname._M_dataplus._M_p = (pointer)&(this->outputRoot).m_pathname.field_2;
  (this->outputRoot).m_pathname._M_string_length = 0;
  (this->outputRoot).m_pathname.field_2._M_local_buf[0] = '\0';
  __nbytes = &(this->projectRoot).m_pathname.field_2;
  (this->projectRoot).m_pathname._M_dataplus._M_p = (pointer)__nbytes;
  (this->projectRoot).m_pathname._M_string_length = 0;
  (this->projectRoot).m_pathname.field_2._M_local_buf[0] = '\0';
  this->recursive = false;
  boost::filesystem::path::path((path *)&in,"config-cpp-dependencies.txt");
  bVar2 = boost::filesystem::is_regular_file((path *)&in);
  std::__cxx11::string::~string((string *)&in);
  if (bVar2) {
    boost::filesystem::path::path(&local_258,"config-cpp-dependencies.txt");
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream(&in,&local_258)
    ;
    std::__cxx11::string::~string((string *)&local_258);
    Configuration::read(&this->config,(int)&in,__buf,(size_t)__nbytes);
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::~basic_ifstream(&in);
  }
  RegisterCommands(this);
  boost::filesystem::current_path();
  std::__cxx11::string::operator=((string *)&this->outputRoot,(string *)&in);
  std::__cxx11::string::_M_assign((string *)&this->projectRoot);
  std::__cxx11::string::~string((string *)&in);
  return;
}

Assistant:

Operations(int argc, const char** argv)
    : loadStatus(Unloaded)
    , inferredComponents(false)
    , programName(argv[0])
    , allArgs(argv+1, argv+argc)
    , recursive(false)
    {
        if (filesystem::is_regular_file(CONFIG_FILE)) {
            streams::ifstream in(CONFIG_FILE);
            config.read(in);
        }
        RegisterCommands();
        projectRoot = outputRoot = filesystem::current_path();
    }